

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_generic_iterator_t xcb_input_valuator_state_end(xcb_input_valuator_state_iterator_t i)

{
  uint8_t *puVar1;
  xcb_input_valuator_state_t *_aux;
  ulong uVar2;
  ulong uVar3;
  xcb_input_valuator_state_t *pxVar4;
  xcb_generic_iterator_t xVar5;
  
  pxVar4 = i.data;
  uVar2 = i._8_8_ >> 0x20;
  for (uVar3 = i._8_8_ & 0xffffffff; 0 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    puVar1 = &pxVar4->num_valuators;
    pxVar4 = pxVar4 + (ulong)*puVar1 + 1;
    uVar2 = (ulong)*puVar1 * 4 + 4;
  }
  xVar5._8_8_ = (ulong)(uint)(i.rem >> 0x1f & i.rem) | uVar2 << 0x20;
  xVar5.data = pxVar4;
  return xVar5;
}

Assistant:

xcb_generic_iterator_t
xcb_input_valuator_state_end (xcb_input_valuator_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_valuator_state_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}